

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O2

Map * __thiscall
Clasp::ClaspStatistics::Impl::writable<Clasp::ClaspStatistics::Impl::Map>(Impl *this,Key_t k)

{
  bool bVar1;
  Map *pMVar2;
  char *exp;
  uint line;
  char *fmt;
  StatisticObject obj;
  
  StatisticObject::fromRep(k);
  obj.handle_ = k;
  bVar1 = writable(this,k);
  if (bVar1) {
    if (Map::id_s == k >> 0x30) {
      pMVar2 = (Map *)StatisticObject::self(&obj);
      return pMVar2;
    }
    exp = "T::id_s == obj.typeId()";
    fmt = "type error";
    line = 0xce;
  }
  else {
    exp = "writable(k)";
    fmt = "key not writable";
    line = 0xcd;
  }
  Potassco::fail(-2,
                 "T *Clasp::ClaspStatistics::Impl::writable(Key_t) const [T = Clasp::ClaspStatistics::Impl::Map]"
                 ,line,exp,fmt,0);
}

Assistant:

T* writable(Key_t k) const {
		StatisticObject obj = StatisticObject::fromRep(k);
		POTASSCO_REQUIRE(writable(k), "key not writable");
		POTASSCO_REQUIRE(T::id_s == obj.typeId(), "type error");
		return static_cast<T*>(const_cast<void*>(obj.self()));
	}